

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O2

string * NJamSpell::DumpKey<unsigned_int>(string *__return_storage_ptr__,uint *key)

{
  ostream local_198 [8];
  ostream out;
  stringbuf local_88 [8];
  stringbuf buf;
  
  std::__cxx11::stringbuf::stringbuf(local_88);
  std::ostream::ostream(local_198,(streambuf *)local_88);
  NHandyPack::TPodSerializer<unsigned_int>::Dump(local_198,key);
  std::__cxx11::stringbuf::str();
  std::ios_base::~ios_base((ios_base *)&out);
  std::__cxx11::stringbuf::~stringbuf(local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string DumpKey(const T& key) {
    std::stringbuf buf;
    std::ostream out(&buf);
    NHandyPack::Dump(out, key);
    return buf.str();
}